

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void log_topn_densities(float64 *den,uint32 *den_idx,uint32 n_top,uint32 n_density,uint32 veclen,
                       vector_t obs,vector_t *mean,vector_t *var,float32 *log_norm,
                       uint32 *prev_den_idx)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  float64 fVar9;
  double dVar10;
  
  if (prev_den_idx == (uint32 *)0x0) {
    if (n_top != 0) {
      uVar7 = 0;
      do {
        den[uVar7] = -1.8e+307;
        den_idx[uVar7] = n_density + 1;
        uVar7 = uVar7 + 1;
      } while (n_top != uVar7);
    }
  }
  else if (n_top != 0) {
    uVar7 = 0;
    do {
      uVar3 = prev_den_idx[uVar7];
      fVar9 = log_diag_eval(obs,log_norm[uVar3],mean[uVar3],var[uVar3],veclen);
      den_idx[uVar7] = uVar3;
      den[uVar7] = fVar9;
      uVar6 = uVar7;
      if (uVar7 != 0) {
        do {
          uVar1 = uVar6 - 1;
          dVar10 = (double)den[uVar1 & 0xffffffff];
          if ((double)fVar9 <= dVar10) goto LAB_00114439;
          den_idx[uVar6] = den_idx[uVar1 & 0xffffffff];
          den[uVar6] = (float64)dVar10;
          uVar6 = uVar1;
        } while ((int)uVar1 != 0);
        uVar6 = 0;
LAB_00114439:
        den_idx[uVar6 & 0xffffffff] = uVar3;
        den[uVar6 & 0xffffffff] = fVar9;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_top);
  }
  if (n_density != 0) {
    uVar3 = n_top - 1;
    fVar9 = den[uVar3];
    uVar7 = 0;
    do {
      dVar10 = (double)(float)log_norm[uVar7];
      bVar8 = veclen != 0;
      if ((veclen != 0) && ((double)fVar9 < dVar10)) {
        uVar6 = 1;
        do {
          dVar10 = dVar10 - (double)(obs[uVar6 - 1] - mean[uVar7][uVar6 - 1]) *
                            (double)(obs[uVar6 - 1] - mean[uVar7][uVar6 - 1]) *
                            (double)var[uVar7][uVar6 - 1];
          bVar8 = uVar6 < veclen;
          if (!bVar8) break;
          uVar6 = uVar6 + 1;
        } while ((double)fVar9 < dVar10);
      }
      if ((!bVar8) && ((double)fVar9 < dVar10)) {
        if (n_top != 0) {
          lVar5 = 0;
          do {
            if (uVar7 == den_idx[lVar5]) goto LAB_00114588;
            lVar5 = lVar5 + 1;
          } while (n_top != (uint32)lVar5);
        }
        uVar6 = (ulong)uVar3;
        uVar4 = uVar3;
        if (uVar3 != 0) {
          do {
            uVar1 = uVar6 - 1;
            dVar2 = (double)den[uVar1 & 0xffffffff];
            if (dVar10 <= dVar2) {
              uVar4 = (uint)uVar6;
              goto LAB_00114575;
            }
            den_idx[uVar6] = den_idx[uVar1 & 0xffffffff];
            den[uVar6] = (float64)dVar2;
            uVar6 = uVar1;
          } while ((int)uVar1 != 0);
          uVar4 = 0;
        }
LAB_00114575:
        den_idx[uVar4] = (uint32)uVar7;
        den[uVar4] = (float64)dVar10;
        fVar9 = den[uVar3];
      }
LAB_00114588:
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_density);
  }
  return;
}

Assistant:

static void
log_topn_densities(float64 *den,
		   uint32 *den_idx,
		   uint32 n_top,
		   uint32 n_density,
		   uint32 veclen,
		   vector_t obs,
		   vector_t *mean,
		   vector_t *var,
		   float32 *log_norm,
		   uint32 *prev_den_idx)
{
    uint32 i, j, k;
    vector_t m;
    vector_t v;
    float64 diff;
    float64 d;
    float64 worst;	/* worst density value of the top N density values
			   seen so far */

    /* Initialize topn using the previous frame's top codeword indices */
    if (prev_den_idx) {
	for (j = 0; j < n_top; j++) {
	    i = prev_den_idx[j];
	    d = log_diag_eval(obs, log_norm[i],
			      mean[i], var[i], veclen);
	    den_idx[j] = i;
	    den[j] = d;
	    if (j == 0)
		continue;
	    /* Insertion sort them */
	    for (k = j; k > 0 && d > den[k-1]; --k) {
		den_idx[k] = den_idx[k-1];
		den[k] = den[k-1];
	    }
	    den_idx[k] = i;
	    den[k] = d;
	}
    }
    else {
	for (j = 0; j < n_top; j++) {
	    den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
	    den_idx[j] = n_density + 1; /* A non-negative invalid value */
	}
    }

    worst = den[n_top-1];

    for (i = 0; i < n_density; i++) {
	m = mean[i];
	v = var[i];

	/* Initialize distance with the log of the normalization
	   factor for this pdf. */

	d = log_norm[i];

	for (j = 0; (j < veclen) && (d > worst); j++) {
	    diff = obs[j] - m[j];
	    d -= diff * diff * v[j];
	}
	/* Not in topn, so keep going */
	if (j < veclen || d <= worst)
	    continue;

	/* This may already have been in topn from the initialization pass */
	for (j = 0; j < n_top; j++)
	    if (den_idx[j] == i)
		break;
	if (j < n_top)
	    continue; /* It's already there, don't insert it */
	for (k = n_top-1; k > 0 && d > den[k-1]; --k) {
	    den_idx[k] = den_idx[k-1];
	    den[k] = den[k-1];
	}
	den_idx[k] = i;
	den[k] = d;

	worst = den[n_top-1];
    }
    worst = den[n_top-1];
}